

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

string * __thiscall libtorrent::settings_pack::get_str_abi_cxx11_(settings_pack *this,int name)

{
  pointer ppVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string *psVar5;
  pointer ppVar6;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  
  if (get_str[abi:cxx11](int)::empty_abi_cxx11_ == '\0') {
    get_str_abi_cxx11_();
  }
  if ((name & 0xc000U) == 0) {
    ppVar6 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 == 0x208) {
      psVar5 = &ppVar6[name & 0x3fff].second;
    }
    else {
      ppVar6 = (this->m_strings).
               super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->m_strings).
               super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar2 = (long)ppVar1 - (long)ppVar6;
      if (0 < (long)uVar2) {
        uVar2 = (uVar2 >> 3) * -0x3333333333333333;
        do {
          uVar3 = uVar2 >> 1;
          uVar4 = uVar3;
          if (ppVar6[uVar3].first < (ushort)name) {
            uVar4 = ~uVar3 + uVar2;
            ppVar6 = ppVar6 + uVar3 + 1;
          }
          uVar2 = uVar4;
        } while (0 < (long)uVar4);
      }
      if ((ppVar6 == ppVar1) || ((uint)ppVar6->first != name)) {
        psVar5 = (string *)(&DAT_004fef80 + (ulong)(name & 0x3fff) * 0x38);
      }
      else {
        psVar5 = &ppVar6->second;
      }
    }
  }
  else {
    psVar5 = &get_str[abi:cxx11](int)::empty_abi_cxx11_;
  }
  return psVar5;
}

Assistant:

std::string const& settings_pack::get_str(int name) const
	{
		static std::string const empty;
		TORRENT_ASSERT_PRECOND((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return empty;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_strings.size() == settings_pack::num_string_settings)
		{
			TORRENT_ASSERT(m_strings[name & index_mask].first == name);
			return m_strings[name & index_mask].second;
		}
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
		auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
				, &compare_first<std::string>);
		if (i != m_strings.end() && i->first == name) return i->second;

		return str_settings[name & index_mask].default_value;
	}